

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::CommonEdgeCase::init(CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  GLenum GVar1;
  int iVar2;
  InternalError *this_01;
  int minViewportSize;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  MessageBuilder local_198;
  
  MultisampleCase::init(&this->super_MultisampleCase,ctx);
  if ((this->m_caseType == CASETYPE_SMALL_QUADS) &&
     (minViewportSize = 0x20, (this->super_MultisampleCase).m_viewportSize < 0x20)) {
    this_01 = (InternalError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_218,&(this->super_MultisampleCase).m_viewportSize);
    std::operator+(&local_1f8,"Render target width or height too low (is ",&local_218);
    std::operator+(&local_1d8,&local_1f8,", should be at least ");
    de::toString<int>(&local_238,&minViewportSize);
    std::operator+(&local_1b8,&local_1d8,&local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                   &local_1b8,")");
    tcu::InternalError::InternalError(this_01,(string *)&local_198);
    __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  glwEnable(0xbe2);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glEnable(GL_BLEND)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x273);
  glwBlendEquation(0x8006);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBlendEquation(GL_FUNC_ADD)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x274);
  glwBlendFunc(1,1);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBlendFunc(GL_ONE, GL_ONE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x275);
  local_198.m_log =
       ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Additive blending enabled in order to detect (erroneously) overlapping samples");
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return iVar2;
}

Assistant:

void CommonEdgeCase::init (void)
{
	MultisampleCase::init();

	if (m_caseType == CASETYPE_SMALL_QUADS)
	{
		// Check for a big enough viewport. With too small viewports the test case can't analyze the resulting image well enough.

		const int minViewportSize = 32;

		DE_ASSERT(minViewportSize <= getDesiredViewportSize());

		if (m_viewportSize < minViewportSize)
			throw tcu::InternalError("Render target width or height too low (is " + de::toString(m_viewportSize) + ", should be at least " + de::toString(minViewportSize) + ")");
	}

	GLU_CHECK_CALL(glEnable(GL_BLEND));
	GLU_CHECK_CALL(glBlendEquation(GL_FUNC_ADD));
	GLU_CHECK_CALL(glBlendFunc(GL_ONE, GL_ONE));

	m_testCtx.getLog() << TestLog::Message << "Additive blending enabled in order to detect (erroneously) overlapping samples" << TestLog::EndMessage;
}